

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,SSTableDic *dic)

{
  ulong *puVar1;
  pointer ppVar2;
  void *in_RCX;
  ulong extraout_RDX;
  ulong uVar3;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  pointer key;
  uint hash [4];
  
  memset(this,0,0x2800);
  ppVar2 = (dic->
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = extraout_RDX;
  for (key = (dic->
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; key != ppVar2; key = key + 1) {
    hash[0] = 0;
    hash[1] = 0;
    hash[2] = 0;
    hash[3] = 0;
    MurmurHash3_x64_128(key,(int)hash,(uint32_t)uVar3,in_RCX);
    uVar3 = (hash._0_8_ & 0xffffffff) % 0x14000;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)(uVar3 >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
    uVar3 = ((ulong)hash._0_8_ >> 0x20) % 0x14000;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)(uVar3 >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
    uVar3 = (hash._8_8_ & 0xffffffff) % 0x14000;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)(uVar3 >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
    in_RCX = (void *)(((ulong)hash._8_8_ >> 0x20) % 0x14000);
    uVar3 = 1L << ((byte)in_RCX & 0x3f);
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)((ulong)in_RCX >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | uVar3;
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(const SSTableDic &dic) {
  for (const auto &pair : dic) {
    unsigned int hash[4] = {0};
    MurmurHash3_x64_128(&pair.first, sizeof(pair.first), 1, &hash);
    bits[hash[0] % (10240 * 8)] = true;
    bits[hash[1] % (10240 * 8)] = true;
    bits[hash[2] % (10240 * 8)] = true;
    bits[hash[3] % (10240 * 8)] = true;
  }
}